

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Entry.h
# Opt level: O3

void __thiscall
anurbs::Entry<anurbs::BrepTrim>::Entry
          (Entry<anurbs::BrepTrim> *this,shared_ptr<anurbs::BrepTrim> *data,
          shared_ptr<anurbs::Attributes> *attributes)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var1;
  
  (this->super_EntryBase)._vptr_EntryBase = (_func_int **)&PTR_key_abi_cxx11__00373900;
  (this->m_key)._M_dataplus._M_p = (pointer)&(this->m_key).field_2;
  (this->m_key)._M_string_length = 0;
  (this->m_key).field_2._M_local_buf[0] = '\0';
  (this->m_data).super___shared_ptr<anurbs::BrepTrim,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (data->super___shared_ptr<anurbs::BrepTrim,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  p_Var1 = (data->super___shared_ptr<anurbs::BrepTrim,_(__gnu_cxx::_Lock_policy)2>)._M_refcount.
           _M_pi;
  (this->m_data).super___shared_ptr<anurbs::BrepTrim,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
       = p_Var1;
  if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var1->_M_use_count = p_Var1->_M_use_count + 1;
      UNLOCK();
    }
    else {
      p_Var1->_M_use_count = p_Var1->_M_use_count + 1;
    }
  }
  (this->m_attributes).super___shared_ptr<anurbs::Attributes,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (attributes->super___shared_ptr<anurbs::Attributes,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  p_Var1 = (attributes->super___shared_ptr<anurbs::Attributes,_(__gnu_cxx::_Lock_policy)2>).
           _M_refcount._M_pi;
  (this->m_attributes).super___shared_ptr<anurbs::Attributes,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = p_Var1;
  if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded != '\0') {
      p_Var1->_M_use_count = p_Var1->_M_use_count + 1;
      return;
    }
    LOCK();
    p_Var1->_M_use_count = p_Var1->_M_use_count + 1;
    UNLOCK();
  }
  return;
}

Assistant:

Entry(std::shared_ptr<TData> data, std::shared_ptr<Attributes> attributes)
        : m_data(data), m_attributes(attributes)
    {
    }